

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall HPresolve::removeImpliedFreeColumn(HPresolve *this,int col,int i,int k)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ostream *poVar4;
  reference pvVar5;
  reference pvVar6;
  HPresolve *this_00;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  value_type vVar7;
  double dVar8;
  int kk;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> newCosts;
  int j;
  value_type *in_stack_fffffffffffffec8;
  stack<double,_std::deque<double,_std::allocator<double>_>_> *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  int iVar9;
  HPresolve *in_stack_fffffffffffffee0;
  int local_34;
  
  if (0 < *(int *)(in_RDI + 0x7c8)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"PR: Implied free column singleton ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ESI);
    poVar4 = std::operator<<(poVar4," removed.  Row ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_EDX);
    poVar4 = std::operator<<(poVar4," removed.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xad0),9);
  *pvVar5 = *pvVar5 + 1;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xab8),9);
  *pvVar5 = *pvVar5 + 1;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x1a2861);
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
  local_34 = *pvVar5;
  while( true ) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                        (size_type)in_stack_fffffffffffffec8);
    iVar9 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    if (*pvVar5 <= local_34) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                        (size_type)in_stack_fffffffffffffec8);
    iVar9 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                        (size_type)in_stack_fffffffffffffec8);
    if ((*pvVar5 != 0) && (iVar9 != in_ESI)) {
      std::vector<double,_std::allocator<double>_>::at
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                 (size_type)in_stack_fffffffffffffec8);
      std::make_pair<int&,double&>
                ((int *)in_stack_fffffffffffffed0,(double *)in_stack_fffffffffffffec8);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      pvVar6 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      dVar8 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      dVar2 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      dVar3 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      *pvVar6 = dVar8 - (dVar1 * dVar2) / dVar3;
    }
    local_34 = local_34 + 1;
  }
  if (*(int *)(in_RDI + 0x7cc) == 1) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::push((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
            *)in_stack_fffffffffffffed0,(value_type *)in_stack_fffffffffffffec8);
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
  *pvVar5 = 0;
  std::vector<double,_std::allocator<double>_>::at
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
             (size_type)in_stack_fffffffffffffec8);
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
            (in_stack_fffffffffffffed0,(value_type *)in_stack_fffffffffffffec8);
  fillStackRowBounds(in_stack_fffffffffffffee0,iVar9);
  pvVar6 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
  *pvVar6 = 0.0;
  pvVar6 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
  vVar7 = -*pvVar6;
  this_00 = (HPresolve *)
            std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                       (size_type)in_stack_fffffffffffffec8);
  dVar8 = vVar7 / *(double *)&this_00->super_HPreData;
  pvVar6 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                      (size_type)dVar8);
  *pvVar6 = dVar8;
  addChange(this_00,(int)((ulong)vVar7 >> 0x20),SUB84(vVar7,0),(int)((ulong)pvVar6 >> 0x20));
  removeRow(this_00,(int)((ulong)vVar7 >> 0x20));
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this_00);
  return;
}

Assistant:

void HPresolve::removeImpliedFreeColumn(const int col, const int i, const int k) {
	if (iPrint > 0)
		cout << "PR: Implied free column singleton " << col << " removed.  Row "
				<< i << " removed." << endl;

	countRemovedCols[IMPLIED_FREE_SING_COL]++;
	countRemovedRows[IMPLIED_FREE_SING_COL]++;

	//modify costs
	int j;
	vector<pair<int, double> > newCosts;
	for (int kk = ARstart.at(i); kk < ARstart.at(i + 1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j != col) {
			newCosts.push_back(make_pair(j, colCost.at(j)));
			colCost.at(j) = colCost.at(j)
					- colCost.at(col) * ARvalue.at(kk) / Avalue.at(k);
		}
	}
	if (iKKTcheck == 1)
		chk.costs.push(newCosts);

	flagCol.at(col) = 0;
	postValue.push(colCost.at(col));
	fillStackRowBounds(i);

	valueColDual.at(col) = 0;
	valueRowDual.at(i) = -colCost.at(col) / Avalue.at(k);
	addChange(IMPLIED_FREE_SING_COL, i, col);
	removeRow(i);
}